

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

void __thiscall OpenMesh::PropertyT<unsigned_short>::clear(PropertyT<unsigned_short> *this)

{
  pointer puVar1;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }